

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O2

string * __thiscall
duckdb::NumericStatisticsState<unsigned_char,int,duckdb::BaseParquetOperator>::
GetMinValue_abi_cxx11_
          (string *__return_storage_ptr__,
          NumericStatisticsState<unsigned_char,int,duckdb::BaseParquetOperator> *this)

{
  char cVar1;
  
  cVar1 = (**(code **)(*(long *)this + 0x10))(this);
  if (cVar1 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this + 8,this + 0xc);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetMinValue() override {
		return HasStats() ? string(char_ptr_cast(&min), sizeof(T)) : string();
	}